

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_heat_maps_test.cpp
# Opt level: O0

void __thiscall check_vectorize_for_heat_maps::test_method(check_vectorize_for_heat_maps *this)

{
  pointer *__return_storage_ptr__;
  double a;
  undefined8 uVar1;
  size_type sVar2;
  bool bVar3;
  uint dimension;
  size_type sVar4;
  reference pvVar5;
  lazy_ostream *prev;
  basic_cstring<const_char> local_260;
  basic_cstring<const_char> local_250;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_240;
  assertion_result local_220;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  size_type local_1e8;
  size_t i;
  vector<double,_std::allocator<double>_> p_vect;
  value_type_conflict1 local_1c0;
  value_type_conflict1 local_1b8;
  value_type_conflict1 local_1b0;
  value_type_conflict1 local_1a8;
  value_type_conflict1 local_1a0;
  value_type_conflict1 local_198;
  value_type_conflict1 local_190;
  value_type_conflict1 local_188;
  value_type_conflict1 local_180;
  value_type_conflict1 local_178;
  value_type_conflict1 local_170;
  value_type_conflict1 local_168;
  value_type_conflict1 local_160;
  value_type_conflict1 local_158;
  value_type_conflict1 local_150;
  value_type_conflict1 local_148;
  value_type_conflict1 local_140;
  value_type_conflict1 local_138;
  value_type_conflict1 local_130;
  value_type_conflict1 local_128;
  value_type_conflict1 local_120;
  value_type_conflict1 local_118;
  value_type_conflict1 local_110;
  value_type_conflict1 local_108;
  undefined1 local_100 [8];
  vector<double,_std::allocator<double>_> p_vect_template;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_d8;
  undefined1 local_c0 [8];
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> p;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  filter;
  check_vectorize_for_heat_maps *this_local;
  
  __return_storage_ptr__ =
       &p.heat_map.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Gudhi::Persistence_representations::create_Gaussian_filter
            ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)__return_storage_ptr__,0x1e,1.0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_d8,
           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)__return_storage_ptr__);
  dimension = std::numeric_limits<unsigned_int>::max();
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_c0,"data/file_with_diagram",&local_d8,false,5,0.0,1.0,dimension);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_d8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_100);
  local_108 = 0.0606728;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_108);
  local_110 = 0.0610023;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_110);
  local_118 = 0.0607978;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_118);
  local_120 = 0.0600647;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_120);
  local_128 = 0.0588224;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_128);
  local_130 = 0.0619829;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_130);
  local_138 = 0.0623218;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_138);
  local_140 = 0.0621152;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_140);
  local_148 = 0.0613686;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_148);
  local_150 = 0.0601016;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_150);
  local_158 = 0.0627679;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_158);
  local_160 = 0.0631134;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_160);
  local_168 = 0.0629066;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_168);
  local_170 = 0.0621528;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_170);
  local_178 = 0.0608719;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_178);
  local_180 = 0.0630073;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_180);
  local_188 = 0.0633564;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_188);
  local_190 = 0.0631511;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_190);
  local_198 = 0.0623968;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_198);
  local_1a0 = 0.0611132;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_1a0);
  local_1a8 = 0.0626947;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_1a8);
  local_1b0 = 0.0630445;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_1b0);
  local_1b8 = 0.0628425;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_1b8);
  local_1c0 = 0.0620941;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,&local_1c0);
  p_vect.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3faf23aafff36ac6;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_100,
             (value_type_conflict1 *)
             &p_vect.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::vectorize
            ((vector<double,_std::allocator<double>_> *)&i,
             (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_c0,0);
  for (local_1e8 = 0; sVar2 = local_1e8,
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)&i), sVar2 != sVar4;
      local_1e8 = local_1e8 + 1) {
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
                 ,0x89);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_208);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f8,0x7b,&local_208);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_100,local_1e8);
      a = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&i,local_1e8);
      bVar3 = Gudhi::Persistence_representations::almost_equal(a,*pvVar5);
      boost::test_tools::assertion_result::assertion_result(&local_220,bVar3);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_250,"almost_equal(p_vect_template[i], p_vect[i])",0x2b);
      boost::unit_test::operator<<(&local_240,prev,&local_250);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
                 ,0x89);
      boost::test_tools::tt_detail::report_assertion(&local_220,&local_240,&local_260,0x7b,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_240);
      boost::test_tools::assertion_result::~assertion_result(&local_220);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_100);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps
            ((Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *
             )local_c0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&p.heat_map.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_vectorize_for_heat_maps) {
  std::vector<std::vector<double> > filter = create_Gaussian_filter(30, 1);
  Persistence_heat_maps<constant_scaling_function> p("data/file_with_diagram", filter, false, 5, 0, 1);

  std::vector<double> p_vect_template;

  p_vect_template.push_back(0.0606728);
  p_vect_template.push_back(0.0610023);
  p_vect_template.push_back(0.0607978);
  p_vect_template.push_back(0.0600647);
  p_vect_template.push_back(0.0588224);
  p_vect_template.push_back(0.0619829);
  p_vect_template.push_back(0.0623218);
  p_vect_template.push_back(0.0621152);
  p_vect_template.push_back(0.0613686);
  p_vect_template.push_back(0.0601016);
  p_vect_template.push_back(0.0627679);
  p_vect_template.push_back(0.0631134);
  p_vect_template.push_back(0.0629066);
  p_vect_template.push_back(0.0621528);
  p_vect_template.push_back(0.0608719);
  p_vect_template.push_back(0.0630073);
  p_vect_template.push_back(0.0633564);
  p_vect_template.push_back(0.0631511);
  p_vect_template.push_back(0.0623968);
  p_vect_template.push_back(0.0611132);
  p_vect_template.push_back(0.0626947);
  p_vect_template.push_back(0.0630445);
  p_vect_template.push_back(0.0628425);
  p_vect_template.push_back(0.0620941);
  p_vect_template.push_back(0.060819);

  std::vector<double> p_vect = p.vectorize(0);
  for (size_t i = 0; i != p_vect.size(); ++i) {
    BOOST_CHECK(almost_equal(p_vect_template[i], p_vect[i]));
  }
}